

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::GPUShaderFP64Test10::prepareComponents
          (GPUShaderFP64Test10 *this,functionObject *function_object,GLuint vertex,GLuint argument,
          GLubyte *buffer)

{
  double dVar1;
  functionEnum fVar2;
  _variable_type _Var3;
  uint uVar4;
  GLuint GVar5;
  TestError *this_00;
  ulong uVar6;
  GLuint *argument_dst;
  ulong uVar7;
  double dVar8;
  double __x;
  GLuint argument_step [3];
  GLuint argument_reset [3];
  double local_68 [3];
  GLuint argument_index [3];
  
  argument_index[2] = 0;
  argument_index[0] = 0;
  argument_index[1] = 0;
  argument_reset[2] = 0;
  argument_reset[0] = 0;
  argument_reset[1] = 0;
  argument_step[2] = 0;
  argument_step[0] = 0;
  argument_step[1] = 0;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_68[2] = 0.0;
  _Var3 = (*function_object->_vptr_functionObject[4])(function_object,(ulong)argument);
  _Var3 = Utils::getBaseVariableType(_Var3);
  uVar4 = (*function_object->_vptr_functionObject[3])(function_object);
  GVar5 = functionObject::getArgumentComponents(function_object,argument);
  uVar6 = (ulong)GVar5;
  if (uVar4 == 3) {
    argument_step[0] = 0x40;
    argument_step[1] = 8;
    argument_step[2] = 1;
    argument_reset[0] = 0x10;
    argument_reset[1] = 8;
    argument_reset[2] = 8;
    local_68[0] = -7.5;
    local_68[1] = -3.5;
    local_68[2] = -3.5;
  }
  else if (uVar4 == 2) {
    argument_step[0] = 0x20;
    argument_step[1] = 1;
    argument_reset[0] = 0x20;
    argument_reset[1] = 0x20;
    local_68[0] = -15.5;
    local_68[1] = -15.5;
  }
  else {
    if (uVar4 != 1) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Not implemented",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0x399b);
      goto LAB_009f08d0;
    }
    argument_step[0] = 1;
    argument_reset[0] = 0x400;
    local_68[0] = -511.5;
  }
  fVar2 = function_object->m_function_enum;
  if (fVar2 - FUNCTION_CLAMP < 2) {
    local_68[2] = 4.5;
LAB_009f075d:
  }
  else {
    if (fVar2 - FUNCTION_SMOOTHSTEP < 2) {
      argument_step[0] = 1;
      argument_step[1] = 8;
      argument_step[2] = 0x40;
      argument_reset[0] = 8;
      argument_reset[1] = 8;
      argument_reset[2] = 0x10;
      local_68[0] = -3.5;
      local_68[1] = 4.5;
      local_68[2] = -7.5;
      goto LAB_009f075d;
    }
    if (fVar2 == FUNCTION_INVERSESQRT) {
      local_68[0] = 16.5;
    }
  }
  for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
    argument_index[uVar7] =
         (GLuint)(((ulong)vertex / (ulong)argument_step[uVar7]) % (ulong)argument_reset[uVar7]);
  }
  if (_Var3 == VARIABLE_TYPE_DOUBLE) {
    uVar4 = argument_index[argument];
    dVar1 = local_68[argument];
    for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      __x = (double)(int)uVar7 * 0.125 + (double)uVar4 + dVar1;
      if (fVar2 == FUNCTION_ROUND) {
        dVar8 = floor(__x);
        if ((__x - dVar8 == 0.5) && (!NAN(__x - dVar8))) {
          __x = __x + 0.01;
        }
      }
      *(double *)(buffer + uVar7 * 8) = __x;
    }
  }
  else if (_Var3 == VARIABLE_TYPE_UINT) {
    GVar5 = argument_index[argument];
    for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      *(GLuint *)(buffer + uVar7 * 4) = GVar5 + (int)uVar7;
    }
  }
  else {
    if (_Var3 != VARIABLE_TYPE_INT) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Not implemented",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0x39f7);
LAB_009f08d0:
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      *(int *)(buffer + uVar7 * 4) = (int)uVar7 + -4;
    }
  }
  return;
}

Assistant:

void GPUShaderFP64Test10::prepareComponents(const functionObject& function_object, glw::GLuint vertex,
											glw::GLuint argument, glw::GLubyte* buffer)
{
	glw::GLuint					argument_index[3]		 = { 0 };
	glw::GLuint					argument_reset[3]		 = { 0 };
	glw::GLuint					argument_step[3]		 = { 0 };
	glw::GLdouble				double_argument_start[3] = { 0.0 };
	const Utils::_variable_type base_arg_type = Utils::getBaseVariableType(function_object.getArgumentType(argument));
	glw::GLuint					int_argument_start  = -4;
	const glw::GLuint			n_arguments			= function_object.getArgumentCount();
	const glw::GLuint			n_components		= function_object.getArgumentComponents(argument);
	glw::GLuint					uint_argument_start = 0;

	switch (n_arguments)
	{
	case 1:
		argument_step[0]		 = 1;
		argument_reset[0]		 = 1024;
		double_argument_start[0] = -511.5;
		break;
	case 2:
		argument_step[0]		 = 32;
		argument_step[1]		 = 1;
		argument_reset[0]		 = 32;
		argument_reset[1]		 = 32;
		double_argument_start[0] = -15.5;
		double_argument_start[1] = -15.5;
		break;
	case 3:
		argument_step[0]		 = 64;
		argument_step[1]		 = 8;
		argument_step[2]		 = 1;
		argument_reset[0]		 = 16;
		argument_reset[1]		 = 8;
		argument_reset[2]		 = 8;
		double_argument_start[0] = -7.5;
		double_argument_start[1] = -3.5;
		double_argument_start[2] = -3.5;
		break;
	default:
		TCU_FAIL("Not implemented");
		return;
		break;
	};

	switch (function_object.getFunctionEnum())
	{
	case FUNCTION_CLAMP: /* arg_2 must be less than arg_3 */
	case FUNCTION_CLAMP_AGAINST_SCALAR:
		double_argument_start[2] = 4.5;
		break;
	case FUNCTION_INVERSESQRT: /* inversesqrt is undefined for argument <= 0 */
		double_argument_start[0] = 16.5;
		break;
	case FUNCTION_SMOOTHSTEP: /* arg_1 must be less than arg_2 */
	case FUNCTION_SMOOTHSTEP_AGAINST_SCALAR:
		argument_step[0]		 = 1;
		argument_step[1]		 = 8;
		argument_step[2]		 = 64;
		argument_reset[0]		 = 8;
		argument_reset[1]		 = 8;
		argument_reset[2]		 = 16;
		double_argument_start[0] = -3.5;
		double_argument_start[1] = 4.5;
		double_argument_start[2] = -7.5;
		break;
	default:
		break;
	}

	for (glw::GLuint i = 0; i < n_arguments; ++i)
	{
		argument_index[i] = (vertex / argument_step[i]) % argument_reset[i];
	}

	switch (base_arg_type)
	{
	case Utils::VARIABLE_TYPE_DOUBLE:
	{
		glw::GLdouble* argument_dst = (glw::GLdouble*)buffer;

		double_argument_start[argument] += argument_index[argument];

		for (glw::GLuint component = 0; component < n_components; ++component)
		{
			glw::GLdouble value = double_argument_start[argument] + ((glw::GLdouble)component) / 8.0;

			switch (function_object.getFunctionEnum())
			{
			case FUNCTION_ROUND: /* Result for 0.5 depends on implementation */
				if (0.5 == Math::fract(value))
				{
					value += 0.01;
				}
				break;
			default:
				break;
			}

			argument_dst[component] = value;
		}
	}
	break;
	case Utils::VARIABLE_TYPE_INT:
	{
		glw::GLint* argument_dst = (glw::GLint*)buffer;

		uint_argument_start += argument_index[argument];

		for (glw::GLuint component = 0; component < n_components; ++component)
		{
			const glw::GLint value = int_argument_start + component;

			argument_dst[component] = value;
		}
	}
	break;
	case Utils::VARIABLE_TYPE_UINT:
	{
		glw::GLuint* argument_dst = (glw::GLuint*)buffer;

		uint_argument_start += argument_index[argument];

		for (glw::GLuint component = 0; component < n_components; ++component)
		{
			const glw::GLuint value = uint_argument_start + component;

			argument_dst[component] = value;
		}
	}
	break;
	default:
		TCU_FAIL("Not implemented");
		return;
		break;
	}
}